

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSetBgColor(ImGuiTableBgTarget target,ImU32 color,int column_n)

{
  float *pfVar1;
  short sVar2;
  ImGuiTable *pIVar3;
  ImGuiTableCellData *pIVar4;
  ImU32 IVar5;
  
  pIVar3 = GImGui->CurrentTable;
  IVar5 = 0;
  if (color != 0x1000000) {
    IVar5 = color;
  }
  if (target - 1U < 2) {
    pfVar1 = &(pIVar3->InnerClipRect).Max.y;
    if (pIVar3->RowPosY1 < *pfVar1 || pIVar3->RowPosY1 == *pfVar1) {
      pIVar3->RowBgColor[target == 2] = IVar5;
    }
  }
  else if ((target == 3) &&
          (pfVar1 = &(pIVar3->InnerClipRect).Max.y,
          pIVar3->RowPosY1 < *pfVar1 || pIVar3->RowPosY1 == *pfVar1)) {
    if (column_n == -1) {
      column_n = pIVar3->CurrentColumn;
    }
    if ((pIVar3->VisibleMaskByIndex[column_n >> 5] >> (column_n & 0x1fU) & 1) != 0) {
      sVar2 = pIVar3->RowCellDataCurrent;
      if (((long)sVar2 < 0) || (column_n != (pIVar3->RowCellData).Data[sVar2].Column)) {
        pIVar3->RowCellDataCurrent = sVar2 + 1;
      }
      sVar2 = pIVar3->RowCellDataCurrent;
      pIVar4 = (pIVar3->RowCellData).Data;
      pIVar4[sVar2].BgColor = IVar5;
      pIVar4[sVar2].Column = (ImGuiTableColumnIdx)column_n;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::TableSetBgColor(ImGuiTableBgTarget target, ImU32 color, int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(target != ImGuiTableBgTarget_None);

    if (color == IM_COL32_DISABLE)
        color = 0;

    // We cannot draw neither the cell or row background immediately as we don't know the row height at this point in time.
    switch (target)
    {
    case ImGuiTableBgTarget_CellBg:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        if (column_n == -1)
            column_n = table->CurrentColumn;
        if (!IM_BITARRAY_TESTBIT(table->VisibleMaskByIndex, column_n))
            return;
        if (table->RowCellDataCurrent < 0 || table->RowCellData[table->RowCellDataCurrent].Column != column_n)
            table->RowCellDataCurrent++;
        ImGuiTableCellData* cell_data = &table->RowCellData[table->RowCellDataCurrent];
        cell_data->BgColor = color;
        cell_data->Column = (ImGuiTableColumnIdx)column_n;
        break;
    }
    case ImGuiTableBgTarget_RowBg0:
    case ImGuiTableBgTarget_RowBg1:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        IM_ASSERT(column_n == -1);
        int bg_idx = (target == ImGuiTableBgTarget_RowBg1) ? 1 : 0;
        table->RowBgColor[bg_idx] = color;
        break;
    }
    default:
        IM_ASSERT(0);
    }
}